

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

UChar * u_memset_63(UChar *dest,UChar c,int32_t count)

{
  UChar *pUVar1;
  UChar *pUVar2;
  
  pUVar2 = dest;
  if (0 < count) {
    pUVar1 = dest + (uint)count;
    do {
      *dest = c;
      dest = dest + 1;
    } while (dest < pUVar1);
  }
  return pUVar2;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_memset(UChar *dest, UChar c, int32_t count) {
    if(count > 0) {
        UChar *ptr = dest;
        UChar *limit = dest + count;

        while (ptr < limit) {
            *(ptr++) = c;
        }
    }
    return dest;
}